

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkDelete(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  void *__ptr;
  Vec_Ptr_t *pVVar3;
  int *piVar4;
  int iVar5;
  int i;
  int iVar6;
  int i_1;
  long lVar7;
  int i_2;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    return;
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(pNtk->pExdc);
  }
  if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete((Abc_Ntk_t *)pNtk->pExcare);
  }
  if (pNtk->ntkFunc == ABC_FUNC_BDD) {
    for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar6);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        Cudd_RecursiveDeref((DdManager *)pNtk->pManFunc,(DdNode *)(pAVar2->field_5).pData);
      }
    }
  }
  iVar6 = 0;
  do {
    pVVar3 = pNtk->vObjs;
    iVar5 = pVVar3->nSize;
    if (iVar5 <= iVar6) {
      if (pNtk->pMmStep == (Mem_Step_t *)0x0) {
        for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
          pAVar2 = Abc_NtkObj(pNtk,iVar6);
          if (pAVar2 != (Abc_Obj_t *)0x0) {
            piVar4 = (pAVar2->vFanouts).pArray;
            if (piVar4 != (int *)0x0) {
              free(piVar4);
              (pAVar2->vFanouts).pArray = (int *)0x0;
            }
            piVar4 = (pAVar2->vFanins).pArray;
            if (piVar4 != (int *)0x0) {
              free(piVar4);
              (pAVar2->vFanins).pArray = (int *)0x0;
            }
          }
          pVVar3 = pNtk->vObjs;
          iVar5 = pVVar3->nSize;
        }
      }
      if (pNtk->pMmObj == (Mem_Fixed_t *)0x0) {
        for (iVar6 = 0; iVar6 < pVVar3->nSize; iVar6 = iVar6 + 1) {
          pAVar2 = Abc_NtkObj(pNtk,iVar6);
          free(pAVar2);
          pVVar3 = pNtk->vObjs;
        }
      }
      Vec_PtrFree(pNtk->vPios);
      Vec_PtrFree(pNtk->vPis);
      Vec_PtrFree(pNtk->vPos);
      Vec_PtrFree(pNtk->vCis);
      Vec_PtrFree(pNtk->vCos);
      Vec_PtrFree(pNtk->vObjs);
      Vec_PtrFree(pNtk->vBoxes);
      piVar4 = (pNtk->vTravIds).pArray;
      if (piVar4 != (int *)0x0) {
        free(piVar4);
        (pNtk->vTravIds).pArray = (int *)0x0;
      }
      if (pNtk->vLevelsR != (Vec_Int_t *)0x0) {
        Vec_IntFree(pNtk->vLevelsR);
      }
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
        pNtk->pSeqModel = (Abc_Cex_t *)0x0;
      }
      pVVar3 = pNtk->vSeqModelVec;
      if (pVVar3 != (Vec_Ptr_t *)0x0) {
        for (iVar6 = 0; iVar6 < pVVar3->nSize; iVar6 = iVar6 + 1) {
          __ptr = Vec_PtrEntry(pVVar3,iVar6);
          if ((void *)0x2 < __ptr) {
            free(__ptr);
          }
        }
        Vec_PtrFree(pVVar3);
      }
      if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
        Mem_FixedReadMemUsage(pNtk->pMmObj);
      }
      if (pNtk->pMmStep != (Mem_Step_t *)0x0) {
        Mem_StepReadMemUsage(pNtk->pMmStep);
      }
      if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
        Mem_FixedStop(pNtk->pMmObj,0);
      }
      if (pNtk->pMmStep != (Mem_Step_t *)0x0) {
        Mem_StepStop(pNtk->pMmStep,0);
      }
      Nm_ManFree(pNtk->pManName);
      if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
        Abc_ManTimeStop(pNtk->pManTime);
      }
      Vec_IntFreeP(&pNtk->vPhases);
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        Abc_AigFree((Abc_Aig_t *)pNtk->pManFunc);
      }
      else {
        switch(pNtk->ntkFunc) {
        case ABC_FUNC_SOP:
        case ABC_FUNC_BLIFMV:
          Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
          break;
        case ABC_FUNC_BDD:
          Extra_StopManager((DdManager *)pNtk->pManFunc);
          break;
        case ABC_FUNC_AIG:
          if ((Hop_Man_t *)pNtk->pManFunc != (Hop_Man_t *)0x0) {
            Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
          }
          break;
        case ABC_FUNC_MAP:
          pNtk->pManFunc = (void *)0x0;
          break;
        case ABC_FUNC_BLACKBOX:
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                        ,0x55f,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
      }
      if (pNtk->pDesign != (Abc_Des_t *)0x0) {
        Abc_DesFree(pNtk->pDesign,pNtk);
        pNtk->pDesign = (Abc_Des_t *)0x0;
      }
      for (iVar6 = 0; iVar6 < pNtk->vAttrs->nSize; iVar6 = iVar6 + 1) {
        piVar4 = (int *)Vec_PtrEntry(pNtk->vAttrs,iVar6);
        if (piVar4 != (int *)0x0) {
          if (*(long *)(piVar4 + 10) != 0) {
            for (lVar7 = 0; lVar7 < *piVar4; lVar7 = lVar7 + 1) {
              if (*(long *)(*(long *)(piVar4 + 2) + lVar7 * 8) != 0) {
                (**(code **)(piVar4 + 10))(*(undefined8 *)(piVar4 + 4));
              }
            }
          }
          if (*(long *)(piVar4 + 4) != 0) {
            (**(code **)(piVar4 + 6))();
          }
          free(*(void **)(piVar4 + 2));
          free(piVar4);
        }
      }
      if (pNtk->pSCLib != (void *)0x0) {
        __assert_fail("pNtk->pSCLib == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                      ,0x56c,"void Abc_NtkDelete(Abc_Ntk_t *)");
      }
      Vec_IntFreeP(&pNtk->vGates);
      Vec_PtrFree(pNtk->vAttrs);
      Vec_IntFreeP(&pNtk->vNameIds);
      if (pNtk->pWLoadUsed != (char *)0x0) {
        free(pNtk->pWLoadUsed);
        pNtk->pWLoadUsed = (char *)0x0;
      }
      if (pNtk->pName != (char *)0x0) {
        free(pNtk->pName);
        pNtk->pName = (char *)0x0;
      }
      if (pNtk->pSpec != (char *)0x0) {
        free(pNtk->pSpec);
        pNtk->pSpec = (char *)0x0;
      }
      if (pNtk->pLutTimes != (float *)0x0) {
        free(pNtk->pLutTimes);
        pNtk->pLutTimes = (float *)0x0;
      }
      pVVar3 = pNtk->vOnehots;
      if (pVVar3 != (Vec_Ptr_t *)0x0) {
        for (lVar7 = 0; lVar7 < pVVar3->nSize; lVar7 = lVar7 + 1) {
          if ((Vec_Ptr_t *)pVVar3->pArray[lVar7] != (Vec_Ptr_t *)0x0) {
            Vec_PtrFree((Vec_Ptr_t *)pVVar3->pArray[lVar7]);
          }
        }
        Vec_PtrFree(pVVar3);
      }
      Vec_PtrFreeP(&pNtk->vLtlProperties);
      Vec_IntFreeP(&pNtk->vObjPerm);
      Vec_IntFreeP(&pNtk->vTopo);
      free(pNtk);
      return;
    }
    pAVar2 = Abc_NtkObj(pNtk,iVar6);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      uVar1 = *(uint *)&pAVar2->field_0x14;
      if ((uVar1 & 0x10) != 0) {
        __assert_fail("pObj->fMarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                      ,0x521,"void Abc_NtkDelete(Abc_Ntk_t *)");
      }
      if ((uVar1 & 0x20) != 0) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                      ,0x522,"void Abc_NtkDelete(Abc_Ntk_t *)");
      }
      if ((uVar1 & 0x40) != 0) {
        __assert_fail("pObj->fMarkC == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                      ,0x523,"void Abc_NtkDelete(Abc_Ntk_t *)");
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void Abc_NtkDelete( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    void * pAttrMan;
    int TotalMemory, i;
//    int LargePiece = (4 << ABC_NUM_STEPS);
    if ( pNtk == NULL )
        return;
    // free EXDC Ntk
    if ( pNtk->pExdc )
        Abc_NtkDelete( pNtk->pExdc );
    if ( pNtk->pExcare )
        Abc_NtkDelete( (Abc_Ntk_t *)pNtk->pExcare );
    // dereference the BDDs
    if ( Abc_NtkHasBdd(pNtk) )
    {
#ifdef ABC_USE_CUDD
        Abc_NtkForEachNode( pNtk, pObj, i )
            Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pObj->pData );
#endif
    }
    // make sure all the marks are clean
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // free large fanout arrays
//        if ( pNtk->pMmObj && pObj->vFanouts.nCap * 4 > LargePiece )
//            ABC_FREE( pObj->vFanouts.pArray );
        // these flags should be always zero
        // if this is not true, something is wrong somewhere
        assert( pObj->fMarkA == 0 );
        assert( pObj->fMarkB == 0 );
        assert( pObj->fMarkC == 0 );
    }
    // free the nodes
    if ( pNtk->pMmStep == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            ABC_FREE( pObj->vFanouts.pArray );
            ABC_FREE( pObj->vFanins.pArray );
        }
    }
    if ( pNtk->pMmObj == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
            ABC_FREE( pObj );
    }
        
    // free the arrays
    Vec_PtrFree( pNtk->vPios );
    Vec_PtrFree( pNtk->vPis );
    Vec_PtrFree( pNtk->vPos );
    Vec_PtrFree( pNtk->vCis );
    Vec_PtrFree( pNtk->vCos );
    Vec_PtrFree( pNtk->vObjs );
    Vec_PtrFree( pNtk->vBoxes );
    ABC_FREE( pNtk->vTravIds.pArray );
    if ( pNtk->vLevelsR ) Vec_IntFree( pNtk->vLevelsR );
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    TotalMemory  = 0;
    TotalMemory += pNtk->pMmObj? Mem_FixedReadMemUsage(pNtk->pMmObj)  : 0;
    TotalMemory += pNtk->pMmStep? Mem_StepReadMemUsage(pNtk->pMmStep) : 0;
//    fprintf( stdout, "The total memory allocated internally by the network = %0.2f MB.\n", ((double)TotalMemory)/(1<<20) );
    // free the storage 
    if ( pNtk->pMmObj )
        Mem_FixedStop( pNtk->pMmObj, 0 );
    if ( pNtk->pMmStep )
        Mem_StepStop ( pNtk->pMmStep, 0 );
    // name manager
    Nm_ManFree( pNtk->pManName );
    // free the timing manager
    if ( pNtk->pManTime )
        Abc_ManTimeStop( pNtk->pManTime );
    Vec_IntFreeP( &pNtk->vPhases );
    // start the functionality manager
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigFree( (Abc_Aig_t *)pNtk->pManFunc );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        Extra_StopManager( (DdManager *)pNtk->pManFunc );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        { if ( pNtk->pManFunc ) Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc ); }
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = NULL;
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // free the hierarchy
    if ( pNtk->pDesign )
    {
        Abc_DesFree( pNtk->pDesign, pNtk );
        pNtk->pDesign = NULL;
    }
//    if ( pNtk->pBlackBoxes ) 
//        Vec_IntFree( pNtk->pBlackBoxes );
    // free node attributes
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vAttrs, pAttrMan, i )
        if ( pAttrMan )
            Vec_AttFree( (Vec_Att_t *)pAttrMan, 1 );
    assert( pNtk->pSCLib == NULL );
    Vec_IntFreeP( &pNtk->vGates );
    Vec_PtrFree( pNtk->vAttrs );
    Vec_IntFreeP( &pNtk->vNameIds );
    ABC_FREE( pNtk->pWLoadUsed );
    ABC_FREE( pNtk->pName );
    ABC_FREE( pNtk->pSpec );
    ABC_FREE( pNtk->pLutTimes );
    if ( pNtk->vOnehots )
        Vec_VecFree( (Vec_Vec_t *)pNtk->vOnehots );
    Vec_PtrFreeP( &pNtk->vLtlProperties );
    Vec_IntFreeP( &pNtk->vObjPerm );
    Vec_IntFreeP( &pNtk->vTopo );
    ABC_FREE( pNtk );
}